

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::changeRowObj
          (SPxLPBase<double> *this,VectorBase<double> *newRowObj,bool scale)

{
  SPxSense SVar1;
  undefined1 in_DL;
  VectorBase<double> *in_RSI;
  SPxLPBase<double> *in_RDI;
  undefined4 uVar2;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar3;
  VectorBase<double> *this_00;
  
  uVar3 = CONCAT13(in_DL,in_stack_ffffffffffffffec) & 0x1ffffff;
  this_00 = in_RSI;
  LPRowSetBase<double>::obj_w(&in_RDI->super_LPRowSetBase<double>);
  VectorBase<double>::operator=((VectorBase<double> *)in_RDI,in_RSI);
  SVar1 = spxSense(in_RDI);
  if (SVar1 == MINIMIZE) {
    uVar2 = 0xffffffff;
    LPRowSetBase<double>::obj_w(&in_RDI->super_LPRowSetBase<double>);
    VectorBase<double>::operator*=(this_00,(int *)CONCAT44(uVar3,uVar2));
  }
  return;
}

Assistant:

virtual void changeRowObj(const VectorBase<R>& newRowObj, bool scale = false)
   {
      assert(maxRowObj().dim() == newRowObj.dim());
      LPRowSetBase<R>::obj_w() = newRowObj;

      if(spxSense() == MINIMIZE)
         LPRowSetBase<R>::obj_w() *= -1;

      assert(isConsistent());
   }